

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_frame.c
# Opt level: O0

size_t nghttp2_frame_trail_padlen(nghttp2_frame *frame,size_t padlen)

{
  size_t padlen_local;
  nghttp2_frame *frame_local;
  
  if (padlen == 0) {
    frame_local = (nghttp2_frame *)0x0;
  }
  else {
    frame_local = (nghttp2_frame *)
                  (padlen - (long)(int)(uint)(((frame->hd).flags & 8) != 0 &&
                                             -1 < (int)((frame->hd).flags & 8)));
  }
  return (size_t)frame_local;
}

Assistant:

size_t nghttp2_frame_trail_padlen(nghttp2_frame *frame, size_t padlen) {
  /* We have iframe->padlen == 0, but iframe->frame.hd.flags may have
     NGHTTP2_FLAG_PADDED set.  This happens when receiving
     CONTINUATION frame, since we don't reset flags after HEADERS was
     received. */
  if (padlen == 0) {
    return 0;
  }
  return padlen - ((frame->hd.flags & NGHTTP2_FLAG_PADDED) > 0);
}